

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membervariable.cpp
# Opt level: O0

MemberVariable * __thiscall
cppgenerate::MemberVariable::operator=(MemberVariable *this,MemberVariable *other)

{
  MemberVariable *other_local;
  MemberVariable *this_local;
  
  if (this != other) {
    Variable::operator=(&this->super_Variable,&other->super_Variable);
    this->m_access = other->m_access;
    this->m_generateGetter = (bool)(other->m_generateGetter & 1);
    this->m_generateSetter = (bool)(other->m_generateSetter & 1);
    this->m_isQProperty = (bool)(other->m_isQProperty & 1);
    std::__cxx11::string::operator=
              ((string *)&this->m_changedSignalName,(string *)&other->m_changedSignalName);
  }
  return this;
}

Assistant:

MemberVariable& MemberVariable::operator=( const MemberVariable& other ){
    if( this != &other ){
        Variable::operator=( other );
        m_access = other.m_access;
        m_generateGetter = other.m_generateGetter;
        m_generateSetter = other.m_generateSetter;
        m_isQProperty = other.m_isQProperty;
        m_changedSignalName = other.m_changedSignalName;
    }

    return *this;
}